

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

int aead_chacha20poly1305_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  EVP_CIPHER *cipher;
  int iVar1;
  
  cipher = (EVP_CIPHER *)EVP_chacha20_poly1305();
  iVar1 = aead_setup_crypto(ctx,is_enc,key,cipher);
  return iVar1;
}

Assistant:

static int aead_chacha20poly1305_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;

    ctx->super.dispose_crypto = chacha20poly1305_dispose_crypto;
    if (is_enc) {
        ctx->super.do_encrypt_init = chacha20poly1305_init;
        ctx->super.do_encrypt_update = chacha20poly1305_encrypt_update;
        ctx->super.do_encrypt_final = chacha20poly1305_encrypt_final;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = chacha20poly1305_decrypt;
    }

    memcpy(ctx->key, key, sizeof(ctx->key));
    return 0;
}